

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

ProtoStreamObjectWriter * __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::StartList
          (ProtoStreamObjectWriter *this,StringPiece name)

{
  int *piVar1;
  Item *pIVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Field *field;
  Item *pIVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  stringpiece_ssize_type sVar7;
  size_t sVar8;
  AlphaNum *in_R8;
  AlphaNum *c;
  StringPiece *pSVar9;
  StringPiece name_00;
  StringPiece name_01;
  StringPiece name_02;
  StringPiece name_03;
  StringPiece value;
  StringPiece value_00;
  AlphaNum local_230;
  AlphaNum local_200;
  StringPiece local_1d0;
  StringPiece local_1c0;
  StringPiece local_1b0;
  StringPiece local_1a0;
  StringPiece local_190;
  StringPiece local_180;
  StringPiece local_170;
  StringPiece local_160;
  StringPiece local_150;
  StringPiece local_140;
  DataPiece local_130;
  StringPiece local_100;
  StringPiece local_f0;
  StringPiece local_e0;
  StringPiece local_d0;
  StringPiece local_c0;
  StringPiece local_b0;
  StringPiece local_a0;
  StringPiece local_90;
  StringPiece local_80;
  StringPiece local_70;
  string local_60;
  StringPiece local_40;
  
  sVar8 = name.length_;
  name_00.ptr_ = name.ptr_;
  iVar5 = (this->super_ProtoWriter).invalid_depth_;
  if (0 < iVar5) {
    (this->super_ProtoWriter).invalid_depth_ = iVar5 + 1;
    return this;
  }
  pIVar2 = (this->current_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>
           ._M_head_impl;
  if (pIVar2 == (Item *)0x0) {
    if (sVar8 != 0) {
      StringPiece::StringPiece(&local_1d0,"Root element should not be named.");
      ProtoWriter::InvalidName(&this->super_ProtoWriter,name,local_1d0);
LAB_00339240:
      piVar1 = &(this->super_ProtoWriter).invalid_depth_;
      *piVar1 = *piVar1 + 1;
      return this;
    }
    bVar3 = std::operator==((this->master_type_->name_).ptr_,"google.protobuf.Value");
    if (bVar3) {
      name_00.length_ = 0;
      ProtoWriter::StartObject(&this->super_ProtoWriter,name_00);
      pIVar6 = (Item *)operator_new(0x40);
      Item::Item(pIVar6,this,MESSAGE,false,false);
      pIVar2 = (this->current_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>
               ._M_head_impl;
      (this->current_)._M_t.
      super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
      .
      super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>
      ._M_head_impl = pIVar6;
      if (pIVar2 != (Item *)0x0) {
        (**(code **)((long)(pIVar2->super_BaseElement)._vptr_BaseElement + 8))();
      }
      StringPiece::StringPiece(&local_1c0,"list_value");
      Push(this,local_1c0,MESSAGE,true,false);
      pSVar9 = &local_1b0;
      goto LAB_00338e28;
    }
    bVar3 = std::operator==((this->master_type_->name_).ptr_,"google.protobuf.ListValue");
    if (!bVar3) {
      name_02.length_ = 0;
      name_02.ptr_ = name_00.ptr_;
      ProtoWriter::StartList(&this->super_ProtoWriter,name_02);
      pIVar6 = (Item *)operator_new(0x40);
      Item::Item(pIVar6,this,MESSAGE,false,true);
      pIVar2 = (this->current_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>
               ._M_head_impl;
      (this->current_)._M_t.
      super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
      .
      super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>
      ._M_head_impl = pIVar6;
      if (pIVar2 == (Item *)0x0) {
        return this;
      }
      (**(code **)((long)(pIVar2->super_BaseElement)._vptr_BaseElement + 8))();
      return this;
    }
    name_01.length_ = 0;
    name_01.ptr_ = name_00.ptr_;
    ProtoWriter::StartObject(&this->super_ProtoWriter,name_01);
    pIVar6 = (Item *)operator_new(0x40);
    Item::Item(pIVar6,this,MESSAGE,false,false);
    pIVar2 = (this->current_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>
             ._M_head_impl;
    (this->current_)._M_t.
    super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
    .
    super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>
    ._M_head_impl = pIVar6;
    if (pIVar2 != (Item *)0x0) {
      (**(code **)((long)(pIVar2->super_BaseElement)._vptr_BaseElement + 8))();
    }
    pSVar9 = &local_1a0;
  }
  else {
    local_230.piece_data_ = name_00.ptr_;
    local_230.piece_size_ = sVar8;
    if (pIVar2->item_type_ != MAP) {
      if (pIVar2->item_type_ == ANY) {
        AnyWriter::StartList
                  ((AnyWriter *)
                   (pIVar2->any_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter>_>
                   ,name);
        return this;
      }
      if (sVar8 == 0) {
        iVar5 = (*(this->super_ProtoWriter).super_StructuredObjectWriter.super_ObjectWriter.
                  _vptr_ObjectWriter[0x11])(this);
        if ((CONCAT44(extraout_var_02,iVar5) != 0) &&
           (iVar5 = (*(this->super_ProtoWriter).super_StructuredObjectWriter.super_ObjectWriter.
                      _vptr_ObjectWriter[0x11])(this),
           *(long *)(CONCAT44(extraout_var_03,iVar5) + 0x28) != 0)) {
          iVar5 = (*(this->super_ProtoWriter).super_StructuredObjectWriter.super_ObjectWriter.
                    _vptr_ObjectWriter[0x11])(this);
          bVar3 = IsStructValue(this,*(Field **)(CONCAT44(extraout_var_04,iVar5) + 0x28));
          if (bVar3) {
            StringPiece::StringPiece(&local_100,"");
            Push(this,local_100,MESSAGE,false,false);
            StringPiece::StringPiece(&local_f0,"list_value");
            Push(this,local_f0,MESSAGE,true,false);
            pSVar9 = &local_e0;
LAB_00338e28:
            bVar3 = true;
            StringPiece::StringPiece(pSVar9,"values");
            name_00.ptr_ = pSVar9->ptr_;
            sVar8 = pSVar9->length_;
            goto LAB_00339123;
          }
          iVar5 = (*(this->super_ProtoWriter).super_StructuredObjectWriter.super_ObjectWriter.
                    _vptr_ObjectWriter[0x11])(this);
          bVar3 = IsStructListValue(this,*(Field **)(CONCAT44(extraout_var_05,iVar5) + 0x28));
          if (bVar3) {
            StringPiece::StringPiece(&local_d0,"");
            Push(this,local_d0,MESSAGE,false,false);
            pSVar9 = &local_c0;
            goto LAB_00339108;
          }
        }
        sVar8 = 0;
      }
      else {
        field = ProtoWriter::Lookup(&this->super_ProtoWriter,name);
        if (field == (Field *)0x0) goto LAB_00339240;
        bVar3 = IsStructValue(this,field);
        if (bVar3) {
          bVar3 = ProtoWriter::IsRepeated(&this->super_ProtoWriter,field);
          if (!bVar3) {
            Push(this,name,MESSAGE,false,false);
            StringPiece::StringPiece(&local_b0,"list_value");
            Push(this,local_b0,MESSAGE,true,false);
            pSVar9 = &local_a0;
            goto LAB_00338e28;
          }
        }
        else {
          bVar3 = IsStructListValue(this,field);
          bVar4 = ProtoWriter::IsRepeated(&this->super_ProtoWriter,field);
          if (bVar3) {
            if (!bVar4) {
              Push(this,name,MESSAGE,false,false);
              pSVar9 = &local_90;
              goto LAB_00339108;
            }
          }
          else {
            if (!bVar4) {
              piVar1 = &(this->super_ProtoWriter).invalid_depth_;
              *piVar1 = *piVar1 + 1;
              StringPiece::StringPiece(&local_80,"Proto field is not repeating, cannot start list.")
              ;
              ProtoWriter::InvalidName(&this->super_ProtoWriter,name,local_80);
              return this;
            }
            bVar3 = IsMap(this,field);
            if ((bVar3) && ((this->options_).use_legacy_json_map_format != true)) {
              StringPiece::StringPiece(&local_40,"Map");
              local_130._vptr_DataPiece = (_func_int **)0x36e29b;
              local_130.type_ = 0x25;
              local_130._12_4_ = 0;
              local_200.piece_data_ = "\'.";
              local_200.piece_size_ = 2;
              StrCat_abi_cxx11_(&local_60,(protobuf *)&local_130,&local_230,&local_200,in_R8);
              sVar7 = StringPiece::CheckedSsizeTFromSizeT(local_60._M_string_length);
              value_00.length_ = sVar7;
              value_00.ptr_ = local_60._M_dataplus._M_p;
              ProtoWriter::InvalidValue(&this->super_ProtoWriter,local_40,value_00);
              std::__cxx11::string::~string((string *)&local_60);
              goto LAB_00339240;
            }
          }
        }
      }
      bVar3 = false;
      goto LAB_00339123;
    }
    bVar3 = ValidMapKey(this,name);
    if (!bVar3) goto LAB_00339240;
    StringPiece::StringPiece(&local_190,"");
    Push(this,local_190,MESSAGE,false,false);
    StringPiece::StringPiece(&local_180,"key");
    local_130.use_strict_base64_decoding_ =
         (this->super_ProtoWriter).super_StructuredObjectWriter.super_ObjectWriter.
         use_strict_base64_decoding_;
    local_130._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    local_130.type_ = TYPE_STRING;
    local_130.field_2.i64_ = (int64)name_00.ptr_;
    local_130.field_2.str_.size_ = sVar8;
    ProtoWriter::RenderDataPiece(&this->super_ProtoWriter,local_180,&local_130);
    StringPiece::StringPiece(&local_170,"value");
    c = (AlphaNum *)0x1;
    Push(this,local_170,MESSAGE,true,false);
    if (0 < (this->super_ProtoWriter).invalid_depth_) {
      return this;
    }
    iVar5 = (*(this->super_ProtoWriter).super_StructuredObjectWriter.super_ObjectWriter.
              _vptr_ObjectWriter[0x11])(this);
    if ((CONCAT44(extraout_var,iVar5) == 0) ||
       (iVar5 = (*(this->super_ProtoWriter).super_StructuredObjectWriter.super_ObjectWriter.
                  _vptr_ObjectWriter[0x11])(this),
       *(long *)(CONCAT44(extraout_var_00,iVar5) + 0x28) == 0)) {
LAB_0033912d:
      StringPiece::StringPiece(&local_70,"Map");
      local_130._vptr_DataPiece = (_func_int **)0x36e26c;
      local_130.type_ = 0x1d;
      local_130._12_4_ = 0;
      local_200.piece_data_ = "\') within a map.";
      local_200.piece_size_ = 0x10;
      StrCat_abi_cxx11_(&local_60,(protobuf *)&local_130,&local_230,&local_200,c);
      sVar7 = StringPiece::CheckedSsizeTFromSizeT(local_60._M_string_length);
      value.length_ = sVar7;
      value.ptr_ = local_60._M_dataplus._M_p;
      ProtoWriter::InvalidValue(&this->super_ProtoWriter,local_70,value);
      std::__cxx11::string::~string((string *)&local_60);
      return this;
    }
    iVar5 = (*(this->super_ProtoWriter).super_StructuredObjectWriter.super_ObjectWriter.
              _vptr_ObjectWriter[0x11])(this);
    bVar3 = IsStructValue(this,*(Field **)(CONCAT44(extraout_var_01,iVar5) + 0x28));
    if (bVar3) {
      StringPiece::StringPiece(&local_160,"list_value");
      Push(this,local_160,MESSAGE,true,false);
      pSVar9 = &local_150;
      goto LAB_00338e28;
    }
    iVar5 = (*(this->super_ProtoWriter).super_StructuredObjectWriter.super_ObjectWriter.
              _vptr_ObjectWriter[0x11])(this);
    bVar3 = IsStructListValue(this,*(Field **)(CONCAT44(extraout_var_06,iVar5) + 0x28));
    if (!bVar3) goto LAB_0033912d;
    pSVar9 = &local_140;
  }
LAB_00339108:
  StringPiece::StringPiece(pSVar9,"values");
  name_00.ptr_ = pSVar9->ptr_;
  sVar8 = pSVar9->length_;
  bVar3 = true;
LAB_00339123:
  name_03.length_ = sVar8;
  name_03.ptr_ = name_00.ptr_;
  Push(this,name_03,MESSAGE,bVar3,true);
  return this;
}

Assistant:

ProtoStreamObjectWriter* ProtoStreamObjectWriter::StartList(
    StringPiece name) {
  if (invalid_depth() > 0) {
    IncrementInvalidDepth();
    return this;
  }

  // Since we cannot have a top-level repeated item in protobuf, the only way
  // this is valid is if we start a special type google.protobuf.ListValue or
  // google.protobuf.Value.
  if (current_ == nullptr) {
    if (!name.empty()) {
      InvalidName(name, "Root element should not be named.");
      IncrementInvalidDepth();
      return this;
    }

    // If master type is a special type that needs extra values to be written to
    // stream, we write those values.
    if (master_type_.name() == kStructValueType) {
      // We got a StartList with google.protobuf.Value master type. This means
      // we have to start the "list_value" within google.protobuf.Value.
      //
      // See
      // https://github.com/protocolbuffers/protobuf/blob/master/src/google/protobuf/struct.proto
      //
      // Render
      // "<name>": {
      //   "list_value": {
      //     "values": [  // Start this list.
      ProtoWriter::StartObject(name);
      current_.reset(new Item(this, Item::MESSAGE, false, false));
      Push("list_value", Item::MESSAGE, true, false);
      Push("values", Item::MESSAGE, true, true);
      return this;
    }

    if (master_type_.name() == kStructListValueType) {
      // We got a StartList with google.protobuf.ListValue master type. This
      // means we have to start the "values" within google.protobuf.ListValue.
      //
      // Render
      // "<name>": {
      //   "values": [  // Start this list.
      ProtoWriter::StartObject(name);
      current_.reset(new Item(this, Item::MESSAGE, false, false));
      Push("values", Item::MESSAGE, true, true);
      return this;
    }

    // Send the event to ProtoWriter so proper errors can be reported.
    //
    // Render a regular list:
    // "<name>": [
    ProtoWriter::StartList(name);
    current_.reset(new Item(this, Item::MESSAGE, false, true));
    return this;
  }

  if (current_->IsAny()) {
    current_->any()->StartList(name);
    return this;
  }

  // If the top of stack is a map, we are starting a list value within a map.
  // Since map does not allow repeated values, this can only happen when the map
  // value is of a special type that renders a list in JSON.  These can be one
  // of 3 cases:
  // i. We are rendering a list value within google.protobuf.Struct
  // ii. We are rendering a list value within google.protobuf.Value
  // iii. We are rendering a list value with type google.protobuf.ListValue.
  if (current_->IsMap()) {
    if (!ValidMapKey(name)) {
      IncrementInvalidDepth();
      return this;
    }

    // Start the repeated map entry object.
    // Render
    // { "key": "<name>", "value": {
    Push("", Item::MESSAGE, false, false);
    ProtoWriter::RenderDataPiece("key",
                                 DataPiece(name, use_strict_base64_decoding()));
    Push("value", Item::MESSAGE, true, false);

    // Make sure we are valid after pushing all above items.
    if (invalid_depth() > 0) return this;

    // case i and ii above. Start "list_value" field within g.p.Value
    if (element() != nullptr && element()->parent_field() != nullptr) {
      // Render
      // "list_value": {
      //   "values": [  // Start this list
      if (IsStructValue(*element()->parent_field())) {
        Push("list_value", Item::MESSAGE, true, false);
        Push("values", Item::MESSAGE, true, true);
        return this;
      }

      // Render
      // "values": [
      if (IsStructListValue(*element()->parent_field())) {
        // case iii above. Bind directly to g.p.ListValue
        Push("values", Item::MESSAGE, true, true);
        return this;
      }
    }

    // Report an error.
    InvalidValue("Map", StrCat("Cannot have repeated items ('", name,
                                     "') within a map."));
    return this;
  }

  // When name is empty and stack is not empty, we are rendering an item within
  // a list.
  if (name.empty()) {
    if (element() != nullptr && element()->parent_field() != nullptr) {
      if (IsStructValue(*element()->parent_field())) {
        // Since it is g.p.Value, we bind directly to the list_value.
        // Render
        // {  // g.p.Value item within the list
        //   "list_value": {
        //     "values": [
        Push("", Item::MESSAGE, false, false);
        Push("list_value", Item::MESSAGE, true, false);
        Push("values", Item::MESSAGE, true, true);
        return this;
      }

      if (IsStructListValue(*element()->parent_field())) {
        // Since it is g.p.ListValue, we bind to it directly.
        // Render
        // {  // g.p.ListValue item within the list
        //   "values": [
        Push("", Item::MESSAGE, false, false);
        Push("values", Item::MESSAGE, true, true);
        return this;
      }
    }

    // Pass the event to underlying ProtoWriter.
    Push(name, Item::MESSAGE, false, true);
    return this;
  }

  // name is not empty
  const google::protobuf::Field* field = Lookup(name);

  if (field == nullptr) {
    IncrementInvalidDepth();
    return this;
  }

  if (IsStructValue(*field)) {
    // If g.p.Value is repeated, start that list. Otherwise, start the
    // "list_value" within it.
    if (IsRepeated(*field)) {
      // Render it just like a regular repeated field.
      // "<name>": [
      Push(name, Item::MESSAGE, false, true);
      return this;
    }

    // Start the "list_value" field.
    // Render
    // "<name>": {
    //   "list_value": {
    //     "values": [
    Push(name, Item::MESSAGE, false, false);
    Push("list_value", Item::MESSAGE, true, false);
    Push("values", Item::MESSAGE, true, true);
    return this;
  }

  if (IsStructListValue(*field)) {
    // If g.p.ListValue is repeated, start that list. Otherwise, start the
    // "values" within it.
    if (IsRepeated(*field)) {
      // Render it just like a regular repeated field.
      // "<name>": [
      Push(name, Item::MESSAGE, false, true);
      return this;
    }

    // Start the "values" field within g.p.ListValue.
    // Render
    // "<name>": {
    //   "values": [
    Push(name, Item::MESSAGE, false, false);
    Push("values", Item::MESSAGE, true, true);
    return this;
  }

  // If we are here, the field should be repeated. Report an error otherwise.
  if (!IsRepeated(*field)) {
    IncrementInvalidDepth();
    InvalidName(name, "Proto field is not repeating, cannot start list.");
    return this;
  }

  if (IsMap(*field)) {
    if (options_.use_legacy_json_map_format) {
      Push(name, Item::MESSAGE, false, true);
      return this;
    }
    InvalidValue("Map", StrCat("Cannot bind a list to map for field '",
                                     name, "'."));
    IncrementInvalidDepth();
    return this;
  }

  // Pass the event to ProtoWriter.
  // Render
  // "<name>": [
  Push(name, Item::MESSAGE, false, true);
  return this;
}